

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O2

void __thiscall chrono::ChLinkLock::ArchiveOUT(ChLinkLock *this,ChArchiveOut *marchive)

{
  LinkType_mapper typemapper;
  ChEnumMapper<chrono::ChLinkLock::LinkType> local_a8;
  ChEnumMapper<chrono::ChLinkLock::LinkType> local_88;
  ChNameValue<chrono::ChLinkForce_*> local_68;
  ChNameValue<double> local_50;
  ChNameValue<chrono::ChEnumMapper<chrono::ChLinkLock::LinkType>_> local_38;
  
  ChArchiveOut::VersionWrite<chrono::ChLinkLock>(marchive);
  ChLinkMarkers::ArchiveOUT(&this->super_ChLinkMarkers,marchive);
  my_enum_mappers_types::LinkType_mapper::LinkType_mapper((LinkType_mapper *)&local_88);
  my_enum_mappers_types::LinkType_mapper::operator()
            (&local_a8,(LinkType_mapper *)&local_88,&this->type);
  local_38._name = "link_type";
  local_38._flags = '\0';
  local_38._value = &local_a8;
  ChArchiveOut::operator<<(marchive,&local_38);
  ChEnumMapper<chrono::ChLinkLock::LinkType>::~ChEnumMapper(&local_a8);
  local_50._value = &this->d_restlength;
  local_50._name = "d_restlength";
  local_50._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_50);
  local_a8.super_ChEnumMapperBase._vptr_ChEnumMapperBase =
       (_func_int **)
       (this->force_D)._M_t.
       super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>._M_t.
       super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
       super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl;
  local_68._name = "force_D.get()";
  local_68._flags = '\0';
  local_68._value = (ChLinkForce **)&local_a8;
  ChArchiveOut::operator<<(marchive,&local_68);
  ChEnumMapper<chrono::ChLinkLock::LinkType>::~ChEnumMapper(&local_88);
  return;
}

Assistant:

void ChLinkLock::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinkLock>();

    // serialize parent class
    ChLinkMarkers::ArchiveOUT(marchive);

    // serialize all member data
    my_enum_mappers_types::LinkType_mapper typemapper;
    marchive << CHNVP(typemapper(type), "link_type");

    ////marchive << CHNVP(mask); //// TODO: needed?

    marchive << CHNVP(d_restlength);

    marchive << CHNVP(force_D.get());

    ////marchive << CHNVP(force_D);
    ////marchive << CHNVP(force_R);
    ////marchive << CHNVP(force_X);
    ////marchive << CHNVP(force_Y);
    ////marchive << CHNVP(force_Z);
    ////marchive << CHNVP(force_Rx);
    ////marchive << CHNVP(force_Ry);
    ////marchive << CHNVP(force_Rz);

    ////marchive << CHNVP(limit_X);
    ////marchive << CHNVP(limit_Y);
    ////marchive << CHNVP(limit_Z);
    ////marchive << CHNVP(limit_Rx);
    ////marchive << CHNVP(limit_Ry);
    ////marchive << CHNVP(limit_Rz);
    ////marchive << CHNVP(limit_Rp);
    ////marchive << CHNVP(limit_D);
}